

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::primitiveTypeToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GLenum primitive)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "points";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "lines";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "line_loop";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "line_strip";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "triangles";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "triangle_strip";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "triangle_fan";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "error";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "lines_adjacency";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "line_strip_adjacency";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "triangles_adjacency";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "triangle_strip_adjacency";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string primitiveTypeToString (GLenum primitive)
{
	switch (primitive)
	{
		case GL_POINTS:						 return "points";
		case GL_LINES:						 return "lines";
		case GL_LINE_LOOP:					 return "line_loop";
		case GL_LINE_STRIP:					 return "line_strip";
		case GL_LINES_ADJACENCY:			 return "lines_adjacency";
		case GL_LINE_STRIP_ADJACENCY:		 return "line_strip_adjacency";
		case GL_TRIANGLES:					 return "triangles";
		case GL_TRIANGLE_STRIP:				 return "triangle_strip";
		case GL_TRIANGLE_FAN:				 return "triangle_fan";
		case GL_TRIANGLES_ADJACENCY:		 return "triangles_adjacency";
		case GL_TRIANGLE_STRIP_ADJACENCY:	 return "triangle_strip_adjacency";
		default:
			DE_ASSERT(DE_FALSE);
			return "error";
	}
}